

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMetaDataDestroy(FmsMetaData *mdata)

{
  FmsMetaData mdata_00;
  int iVar1;
  
  if (mdata == (FmsMetaData *)0x0) {
    iVar1 = 1;
  }
  else {
    mdata_00 = *mdata;
    if (mdata_00 == (FmsMetaData)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = FmsMetaDataClear(mdata_00);
      free(mdata_00);
      *mdata = (FmsMetaData)0x0;
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataDestroy(FmsMetaData *mdata) {
  int err = 0;
  if (!mdata) { E_RETURN(1); }
  FmsMetaData md = *mdata;
  if (md) {
    err = UpdateError(err, FmsMetaDataClear(md));
    free(md);
    *mdata = NULL;
  }
  E_RETURN(err);
}